

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

int __thiscall
testing::internal::ParameterizedTestSuiteInfo<SignedLongLong>::AddTestSuiteInstantiation
          (ParameterizedTestSuiteInfo<SignedLongLong> *this,string *instantiation_name,
          GeneratorCreationFunc *func,ParamNameGeneratorFunc *name_func,char *file,int line)

{
  InstantiationInfo local_70;
  
  std::__cxx11::string::string((string *)&local_70,(string *)instantiation_name);
  local_70.generator = func;
  local_70.name_func = name_func;
  local_70.file = file;
  local_70.line = line;
  std::
  vector<testing::internal::ParameterizedTestSuiteInfo<SignedLongLong>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<SignedLongLong>::InstantiationInfo>_>
  ::emplace_back<testing::internal::ParameterizedTestSuiteInfo<SignedLongLong>::InstantiationInfo>
            (&this->instantiations_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return 0;
}

Assistant:

int AddTestSuiteInstantiation(const std::string& instantiation_name,
                                GeneratorCreationFunc* func,
                                ParamNameGeneratorFunc* name_func,
                                const char* file, int line) {
    instantiations_.push_back(
        InstantiationInfo(instantiation_name, func, name_func, file, line));
    return 0;  // Return value used only to run this method in namespace scope.
  }